

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

matrix3d * tinyusdz::to_matrix3x3(matrix3d *__return_storage_ptr__,quatd *q)

{
  long lVar1;
  double *pdVar2;
  matrix3d *pmVar3;
  byte bVar4;
  double3x3 m33;
  vec<double,_4> local_78;
  double local_58 [9];
  
  bVar4 = 0;
  local_78.x = (q->imag)._M_elems[0];
  local_78.y = (q->imag)._M_elems[1];
  local_78.z = (q->imag)._M_elems[2];
  local_78.w = q->real;
  linalg::qmat<double>(&local_78);
  pdVar2 = local_58;
  pmVar3 = __return_storage_ptr__;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    pmVar3->m[0][0] = *pdVar2;
    pdVar2 = pdVar2 + (ulong)bVar4 * -2 + 1;
    pmVar3 = (matrix3d *)((long)pmVar3 + ((ulong)bVar4 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d to_matrix3x3(const value::quatd &q) {
  double3x3 m33 =
      linalg::qmat<double>({q.imag[0], q.imag[1], q.imag[2], q.real});

  value::matrix3d m;
  Identity(&m);

  memcpy(m.m, &m33[0][0], sizeof(double) * 3 * 3);

  return m;
}